

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::push_top
          (stack<c4::yml::Parser::State,_16UL> *this)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sz;
  
  sVar3 = this->m_size;
  if (sVar3 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_0022f4f8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar3 = this->m_size;
  }
  if (sVar3 == this->m_capacity) {
    sz = 0x10;
    if (sVar3 != 0) {
      sz = sVar3 * 2;
    }
    reserve(this,sz);
    sVar3 = this->m_size;
  }
  memcpy(this->m_stack + sVar3,this->m_stack + (sVar3 - 1),0x98);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_top()
    {
        RYML_ASSERT(m_size > 0);
        if(m_size == m_capacity)
        {
            size_t cap = m_capacity == 0 ? N : 2 * m_capacity;
            reserve(cap);
        }
        m_stack[m_size] = m_stack[m_size - 1];
        ++m_size;
    }